

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  Table *in_RAX;
  HashElem *pHVar7;
  long lVar8;
  uint uVar9;
  Table *pTVar10;
  
  uVar3 = db->nDb;
LAB_00159830:
  if (0 < (int)uVar3) {
    uVar9 = 0;
    pTVar10 = in_RAX;
LAB_0015983e:
    uVar6 = uVar9 < 2 ^ uVar9;
    if (zDatabase != (char *)0x0) {
      lVar8 = 0;
      do {
        bVar1 = zDatabase[lVar8];
        bVar2 = db->aDb[uVar6].zDbSName[lVar8];
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) goto LAB_00159886;
        }
        else if (""[bVar1] != ""[bVar2]) goto LAB_00159886;
        lVar8 = lVar8 + 1;
      } while( true );
    }
    goto LAB_0015988b;
  }
LAB_001598d8:
  lVar8 = 0;
  do {
    bVar1 = zName[lVar8];
    bVar2 = "sqlite_master"[lVar8];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_00159905;
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_00159905;
    lVar8 = lVar8 + 1;
  } while( true );
LAB_00159886:
  if (bVar1 == bVar2) {
LAB_0015988b:
    pHVar7 = findElementWithHash(&(db->aDb[uVar6].pSchema)->tblHash,zName,(uint *)0x0);
    bVar5 = false;
    in_RAX = (Table *)pHVar7->data;
    if ((Table *)pHVar7->data != (Table *)0x0) goto LAB_001598c1;
  }
  bVar5 = true;
  in_RAX = pTVar10;
LAB_001598c1:
  if (!bVar5) {
    return in_RAX;
  }
  uVar9 = uVar9 + 1;
  pTVar10 = in_RAX;
  if (uVar9 == uVar3) goto LAB_001598d8;
  goto LAB_0015983e;
LAB_00159905:
  if (bVar1 != bVar2) {
    return (Table *)0x0;
  }
  pcVar4 = db->aDb[1].zDbSName;
  if (zDatabase != (char *)0x0) {
    if (pcVar4 == (char *)0x0) {
      return (Table *)0x0;
    }
    lVar8 = 0;
    do {
      bVar1 = zDatabase[lVar8];
      if (bVar1 == pcVar4[lVar8]) {
        if ((ulong)bVar1 == 0) goto LAB_00159953;
      }
      else if (""[bVar1] != ""[(byte)pcVar4[lVar8]]) {
        return (Table *)0x0;
      }
      lVar8 = lVar8 + 1;
    } while( true );
  }
  zName = "sqlite_temp_master";
  if (pcVar4 != (char *)0x0) {
    return (Table *)0x0;
  }
  goto LAB_00159830;
LAB_00159953:
  zName = "sqlite_temp_master";
  goto LAB_00159830;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
#if SQLITE_USER_AUTHENTICATION
  /* Only the admin user is allowed to know that the sqlite_user table
  ** exists */
  if( db->auth.authLevel<UAUTH_Admin && sqlite3UserAuthTable(zName)!=0 ){
    return 0;
  }
#endif
  while(1){
    for(i=OMIT_TEMPDB; i<db->nDb; i++){
      int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
      if( zDatabase==0 || sqlite3StrICmp(zDatabase, db->aDb[j].zDbSName)==0 ){
        assert( sqlite3SchemaMutexHeld(db, j, 0) );
        p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName);
        if( p ) return p;
      }
    }
    /* Not found.  If the name we were looking for was temp.sqlite_master
    ** then change the name to sqlite_temp_master and try again. */
    if( sqlite3StrICmp(zName, MASTER_NAME)!=0 ) break;
    if( sqlite3_stricmp(zDatabase, db->aDb[1].zDbSName)!=0 ) break;
    zName = TEMP_MASTER_NAME;
  }
  return 0;
}